

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

int fwdata_device_version(char *device_path)

{
  long lVar1;
  long in_FS_OFFSET;
  uint local_50;
  uint retries;
  int ret;
  char *device_path_local;
  igsc_device_handle local_38;
  igsc_device_handle handle;
  igsc_fwdata_version2 fwdata_version;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 0;
  memset(&local_38,0,8);
  device_path_local._4_4_ = igsc_device_init_by_device(&local_38);
  if (device_path_local._4_4_ == 0) {
    memset((void *)((long)&handle.ctx + 4),0,0x1c);
    do {
      device_path_local._4_4_ =
           igsc_device_fwdata_version2(&local_38,(undefined1 *)((long)&handle.ctx + 4));
      if (device_path_local._4_4_ != 0xd) break;
      gsc_msleep(2000);
      local_50 = local_50 + 1;
    } while (local_50 < 3);
    if (device_path_local._4_4_ == 0) {
      print_dev_fwdata_version((igsc_fwdata_version2 *)((long)&handle.ctx + 4));
    }
    else if (device_path_local._4_4_ == 0xc) {
      if ((quiet & 1U) == 0) {
        fprintf(_stderr,
                "Error: Permission denied: missing required credentials to access the device %s\n",
                device_path);
      }
    }
    else {
      if ((quiet & 1U) == 0) {
        fprintf(_stderr,"Error: Failed to get fwdata version from device: %s\n",device_path);
      }
      print_device_fw_status(&local_38);
    }
    igsc_device_close(&local_38);
  }
  else if ((quiet & 1U) == 0) {
    fprintf(_stderr,"Error: Failed to initialize device: %s\n",device_path);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return device_path_local._4_4_;
}

Assistant:

mockable_static
int fwdata_device_version(const char *device_path)
{
    struct igsc_fwdata_version2 fwdata_version;
    struct igsc_device_handle handle;
    int ret;
    unsigned int retries = 0;

    memset(&handle, 0, sizeof(handle));
    ret = igsc_device_init_by_device(&handle, device_path);
    if (ret != IGSC_SUCCESS)
    {
        fwupd_error("Failed to initialize device: %s\n", device_path);
        return ret;
    }

    memset(&fwdata_version, 0, sizeof(fwdata_version));
    while ((ret = igsc_device_fwdata_version2(&handle, &fwdata_version)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret != IGSC_SUCCESS)
    {
        if (ret == IGSC_ERROR_PERMISSION_DENIED)
        {
            fwupd_error("Permission denied: missing required credentials to access the device %s\n", device_path);
        }
        else
        {
            fwupd_error("Failed to get fwdata version from device: %s\n", device_path);
            print_device_fw_status(&handle);
        }
        goto exit;
    }

    print_dev_fwdata_version(&fwdata_version);

exit:
    (void)igsc_device_close(&handle);
    return ret;
}